

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O3

void __thiscall
InvertDatabase::suffix_add_item_eqgraph(InvertDatabase *this,char use_seq,int it1,int it2)

{
  pointer psVar1;
  int num_class_;
  EqGrNode *this_00;
  
  psVar1 = (this->eqgraph).
           super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1[it2].super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (EqGrNode *)operator_new(0x60);
    num_class_ = ClassInfo::get_num_class
                           ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    EqGrNode::EqGrNode(this_00,2,num_class_);
    std::__shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>::reset<EqGrNode>
              (&psVar1[it2].super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>,this_00);
  }
  Array::add(*(Array **)
              ((long)&((this->eqgraph).
                       super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[it2].
                       super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theElements
              + (ulong)(use_seq != '\0') * 0x10),it1);
  return;
}

Assistant:

void InvertDatabase::suffix_add_item_eqgraph(char use_seq, int it1, int it2) {
    if (eqgraph[it2] == nullptr) {
        eqgraph[it2].reset(new EqGrNode(2, cls->get_num_class()));
    }
    if (use_seq) eqgraph[it2]->seqadd_element(it1);
    else eqgraph[it2]->add_element(it1);
}